

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvectornd.h
# Opt level: O2

QVector3D __thiscall QVector3D::normalized(QVector3D *this)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  QVector3D QVar7;
  
  fVar2 = length(this);
  fVar3 = fVar2 + -1.0;
  uVar1 = -(uint)(fVar3 < -fVar3);
  if ((float)(~uVar1 & (uint)fVar3 | (uint)-fVar3 & uVar1) <= 1e-05) {
    uVar4 = *(undefined8 *)this->v;
    fVar2 = this->v[2];
  }
  else {
    uVar1 = -(uint)(fVar2 < -fVar2);
    if ((float)(~uVar1 & (uint)fVar2 | (uint)-fVar2 & uVar1) <= 1e-05) {
      uVar4 = 0;
      fVar2 = 0.0;
    }
    else {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)this->v;
      auVar6._4_4_ = fVar2;
      auVar6._0_4_ = fVar2;
      auVar6._8_4_ = fVar2;
      auVar6._12_4_ = fVar2;
      auVar6 = divps(auVar5,auVar6);
      uVar4 = auVar6._0_8_;
      fVar2 = this->v[2] / fVar2;
    }
  }
  QVar7.v[2] = fVar2;
  QVar7.v[0] = (float)(int)uVar4;
  QVar7.v[1] = (float)(int)((ulong)uVar4 >> 0x20);
  return (QVector3D)QVar7.v;
}

Assistant:

inline QVector3D QVector3D::normalized() const noexcept
{
    const float len = length();
    return qFuzzyIsNull(len - 1.0f) ? *this : qFuzzyIsNull(len) ? QVector3D()
        : QVector3D(v[0] / len, v[1] / len, v[2] / len);
}